

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPackedFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  Iface *pIVar1;
  Plausibility PVar2;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)> local_28
  ;
  
  local_28.impl.ptr = (Iface *)operator_new(0x10);
  (local_28.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027aa48;
  local_28.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_28.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>::Impl<capnp::compiler::CompilerMain::isPlausiblyPackedFlat(kj::ArrayPtr<unsigned_char_const>)::{lambda(kj::ArrayPtr<unsigned_char_const>)#1}>>
        ::instance;
  PVar2 = isPlausiblyPacked(this,prefix,&local_28);
  pIVar1 = local_28.impl.ptr;
  if (local_28.impl.ptr != (Iface *)0x0) {
    local_28.impl.ptr = (Iface *)0x0;
    (**(local_28.impl.disposer)->_vptr_Disposer)
              (local_28.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  return PVar2;
}

Assistant:

Plausibility isPlausiblyPackedFlat(kj::ArrayPtr<const byte> prefix) {
    return isPlausiblyPacked(prefix, [this](kj::ArrayPtr<const byte> prefix) {
      return isPlausiblyFlat(prefix);
    });
  }